

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O0

pair<google::protobuf::Map<unsigned_int,_proto2_unittest::TestAllTypes>::iterator,_bool> *
__thiscall
google::protobuf::Map<unsigned_int,proto2_unittest::TestAllTypes>::try_emplace<unsigned_int_const&>
          (pair<google::protobuf::Map<unsigned_int,_proto2_unittest::TestAllTypes>::iterator,_bool>
           *__return_storage_ptr__,void *this,uint *k)

{
  uint *k_local;
  Map<unsigned_int,_proto2_unittest::TestAllTypes> *this_local;
  
  TryEmplaceInternal<unsigned_int_const&>(__return_storage_ptr__,this,k);
  return __return_storage_ptr__;
}

Assistant:

std::pair<iterator, bool> try_emplace(K&& k, Args&&... args)
      ABSL_ATTRIBUTE_LIFETIME_BOUND {
    // Case 1: `mapped_type` is arena constructible. A temporary object is
    // created and then (if `Args` are not empty) assigned to a mapped value
    // that was created with the arena.
    if constexpr (Arena::is_arena_constructable<mapped_type>::value) {
      if constexpr (sizeof...(Args) == 0) {
        // case 1.1: "default" constructed (e.g. from arena only).
        return TryEmplaceInternal(std::forward<K>(k));
      } else {
        // case 1.2: "default" constructed + copy/move assignment
        auto p = TryEmplaceInternal(std::forward<K>(k));
        if (p.second) {
          if constexpr (std::is_same<void(typename std::decay<Args>::type...),
                                     void(mapped_type)>::value) {
            // Avoid the temporary when the input is the right type.
            p.first->second = (std::forward<Args>(args), ...);
          } else {
            p.first->second = mapped_type(std::forward<Args>(args)...);
          }
        }
        return p;
      }
    } else {
      // Case 2: `mapped_type` is not arena constructible. Using in-place
      // construction.
      return TryEmplaceInternal(std::forward<K>(k),
                                std::forward<Args>(args)...);
    }
  }